

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<SplitStringTest,_testing::internal::TemplateSel<SplitStringTest_random_long_trailing_delim_Test>,_testing::internal::Types<char8_t,_char16_t,_char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  CodeLocation CVar1;
  bool bVar2;
  SetUpTearDownSuiteFuncType p_Var3;
  SetUpTearDownSuiteFuncType p_Var4;
  undefined8 *puVar5;
  char *__rhs;
  char *str;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  char *local_158 [4];
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  CodeLocation local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe83);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  std::operator+(&local_f8,&local_50,__rhs);
  std::operator+(&local_d8,&local_f8,case_name);
  std::operator+(&local_b8,&local_d8,"/");
  std::operator+(&local_98,&local_b8,
                 (type_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + index);
  GetPrefixUntilComma_abi_cxx11_(&local_138,(internal *)test_names,str);
  StripTrailingSpaces(&local_118,&local_138);
  GetTypeName<char8_t>();
  CodeLocation::CodeLocation(&local_78,code_location);
  p_Var3 = SuiteApiResolver<SplitStringTest_random_long_trailing_delim_Test<char8_t>_>::
           GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  p_Var4 = SuiteApiResolver<SplitStringTest_random_long_trailing_delim_Test<char8_t>_>::
           GetTearDownCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar6 = 0x2eb551;
  puVar5 = (undefined8 *)operator_new(8);
  *puVar5 = &PTR__TestFactoryBase_004b0d70;
  CVar1.file._M_string_length = (size_type)p_Var4;
  CVar1.file._M_dataplus._M_p = (pointer)p_Var3;
  CVar1.file.field_2._M_allocated_capacity = (size_type)puVar5;
  CVar1.file.field_2._8_8_ = uVar6;
  CVar1._32_8_ = in_stack_fffffffffffffe78;
  testing::internal::MakeAndRegisterTestInfo
            (local_98._M_dataplus._M_p,local_118._M_dataplus._M_p,local_158[0],(char *)0x0,CVar1,
             &local_78,(_func_void *)&TypeIdHelper<SplitStringTest<char8_t>>::dummy_,
             (_func_void *)CONCAT44(index,in_stack_fffffffffffffe80),(TestFactoryBase *)test_names);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = TypeParameterizedTest<SplitStringTest,_testing::internal::TemplateSel<SplitStringTest_random_long_trailing_delim_Test>,_testing::internal::Types<char16_t,_char32_t>_>
          ::Register(prefix,code_location,case_name,test_names,index + 1,type_names);
  return bVar2;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }